

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

int Gia_ObjFanin0CopyRepr(Gia_Man_t *p,Gia_Obj_t *pObj,int *pReprs)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2);
  iVar6 = iVar2 * -0x55555555;
  uVar3 = (uint)*(undefined8 *)pObj;
  uVar4 = pReprs[(int)(iVar6 - (uVar3 & 0x1fffffff))];
  if (uVar4 == 0xffffffff) {
    uVar5 = pObj[-(ulong)(uVar3 & 0x1fffffff)].Value;
    if ((int)uVar5 < 0) goto LAB_0022e1bb;
    uVar4 = uVar3 >> 0x1d;
  }
  else {
    if ((int)uVar4 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar5 = uVar4 >> 1;
    if (SBORROW4(uVar5,iVar6) == (int)(uVar5 + iVar2 * 0x55555555) < 0) {
      __assert_fail("Abc_Lit2Var(pReprs[fanId]) < Gia_ObjId(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x14f,"int Gia_ObjFanin0CopyRepr(Gia_Man_t *, Gia_Obj_t *, int *)");
    }
    if (p->nObjs <= (int)uVar5) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar5 = pGVar1[uVar5].Value;
    if ((int)uVar5 < 0) {
LAB_0022e1bb:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar4 = uVar3 >> 0x1d ^ uVar4;
  }
  return uVar4 & 1 ^ uVar5;
}

Assistant:

int Gia_ObjFanin0CopyRepr( Gia_Man_t * p, Gia_Obj_t * pObj, int * pReprs )
{
    int fanId = Gia_ObjFaninId0p( p, pObj );
    if ( pReprs[fanId] == -1 )
        return Gia_ObjFanin0Copy( pObj );
    assert( Abc_Lit2Var(pReprs[fanId]) < Gia_ObjId(p, pObj) );
    return Abc_LitNotCond( Gia_ObjValue(Gia_ManObj(p, Abc_Lit2Var(pReprs[fanId]))), Gia_ObjFaninC0(pObj) ^ Abc_LitIsCompl(pReprs[fanId]) );
}